

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setCategoryRates
          (BeagleCPUImpl<float,_1,_0> *this,double *inCategoryRates)

{
  double **ppdVar1;
  double *pdVar2;
  
  ppdVar1 = this->gCategoryRates;
  if (*ppdVar1 == (double *)0x0) {
    pdVar2 = (double *)malloc((long)this->kCategoryCount << 3);
    *ppdVar1 = pdVar2;
    if (*this->gCategoryRates == (double *)0x0) {
      return -2;
    }
  }
  memcpy(*this->gCategoryRates,inCategoryRates,(long)this->kCategoryCount << 3);
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCategoryRates(const double* inCategoryRates) {
    int categoryRatesIndex=0;
    if (gCategoryRates[categoryRatesIndex] == NULL) {
        gCategoryRates[categoryRatesIndex] = (double*) malloc(sizeof(double) * kCategoryCount);
        if (gCategoryRates[categoryRatesIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    memcpy(gCategoryRates[categoryRatesIndex], inCategoryRates, sizeof(double) * kCategoryCount);
    return BEAGLE_SUCCESS;
}